

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::vector
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this,
          vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *other,
          polymorphic_allocator<unsigned_char> *alloc)

{
  size_t sVar1;
  const_reference args;
  memory_resource *pmVar2;
  undefined8 *in_RDX;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *in_RSI;
  polymorphic_allocator<unsigned_char> *in_RDI;
  size_t i;
  ulong local_20;
  
  in_RDI->memoryResource = (memory_resource *)*in_RDX;
  in_RDI[1].memoryResource = (memory_resource *)0x0;
  in_RDI[2].memoryResource = (memory_resource *)0x0;
  in_RDI[3].memoryResource = (memory_resource *)0x0;
  size(in_RSI);
  reserve(in_RSI,(size_t)in_RDX);
  local_20 = 0;
  while( true ) {
    sVar1 = size(in_RSI);
    if (sVar1 <= local_20) break;
    pmVar2 = in_RDI[1].memoryResource;
    args = operator[](in_RSI,local_20);
    pmr::polymorphic_allocator<unsigned_char>::construct<unsigned_char,unsigned_char_const&>
              (in_RDI,(uchar *)((long)&pmVar2->_vptr_memory_resource + local_20),args);
    local_20 = local_20 + 1;
  }
  pmVar2 = (memory_resource *)size(in_RSI);
  in_RDI[3].memoryResource = pmVar2;
  return;
}

Assistant:

vector(const vector &other, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            this->alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();
    }